

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::logCLInfo(CLIntercept *this)

{
  cl_uint cVar1;
  cl_int cVar2;
  cl_platform_id *pp_Var3;
  cl_device_id *pp_Var4;
  ulong uVar5;
  pthread_mutex_t *__mutex;
  ulong uVar6;
  float __x;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  double __x_00;
  undefined8 uVar7;
  undefined8 extraout_XMM0_Qa_02;
  cl_uint numPlatforms;
  cl_uint local_6c;
  cl_uint local_68;
  allocator local_61;
  pthread_mutex_t *local_60;
  cl_platform_id *local_58;
  string local_50 [32];
  
  if (this->m_LoggedCLInfo == false) {
    __mutex = (pthread_mutex_t *)&this->m_Mutex;
    std::mutex::lock((mutex *)&__mutex->__data);
    if (this->m_LoggedCLInfo == false) {
      this->m_LoggedCLInfo = true;
      local_68 = 0;
      cVar2 = (*(this->m_Dispatch).clGetPlatformIDs)(0,(cl_platform_id *)0x0,&local_68);
      if (local_68 != 0 && cVar2 == 0) {
        logf(this,__x);
        cVar1 = local_68;
        local_60 = __mutex;
        pp_Var3 = (cl_platform_id *)operator_new__((ulong)local_68 * 8);
        cVar2 = (*(this->m_Dispatch).clGetPlatformIDs)(cVar1,pp_Var3,(cl_uint *)0x0);
        uVar7 = extraout_XMM0_Qa;
        local_58 = pp_Var3;
        for (uVar6 = 0; uVar6 < local_68; uVar6 = uVar6 + 1) {
          if (cVar2 == 0) {
            logf(this,(float)uVar7);
            logPlatformInfo(this,pp_Var3[uVar6]);
            local_6c = 0;
            cVar2 = (*(this->m_Dispatch).clGetDeviceIDs)
                              (pp_Var3[uVar6],0xffffffff,0,(cl_device_id *)0x0,&local_6c);
            uVar7 = extraout_XMM0_Qa_00;
            if (local_6c != 0 && cVar2 == 0) {
              logf(this,(float)extraout_XMM0_Qa_00);
              cVar1 = local_6c;
              pp_Var4 = (cl_device_id *)operator_new__((ulong)local_6c * 8);
              cVar2 = (*(this->m_Dispatch).clGetDeviceIDs)
                                (local_58[uVar6],0xffffffff,cVar1,pp_Var4,(cl_uint *)0x0);
              uVar7 = extraout_XMM0_Qa_01;
              for (uVar5 = 0; uVar5 < local_6c; uVar5 = uVar5 + 1) {
                if (cVar2 == 0) {
                  logf(this,(float)uVar7);
                  logDeviceInfo(this,pp_Var4[uVar5]);
                  __x_00 = (double)std::__cxx11::string::string(local_50,"\n",&local_61);
                  log(this,__x_00);
                  uVar7 = std::__cxx11::string::~string(local_50);
                }
              }
              operator_delete__(pp_Var4);
              pp_Var3 = local_58;
              uVar7 = extraout_XMM0_Qa_02;
            }
          }
        }
        operator_delete__(pp_Var3);
        __mutex = local_60;
      }
    }
    pthread_mutex_unlock(__mutex);
  }
  return;
}

Assistant:

void CLIntercept::logCLInfo()
{
    if( m_LoggedCLInfo == false )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        if( m_LoggedCLInfo == false )
        {
            m_LoggedCLInfo = true;

            cl_int  errorCode = CL_SUCCESS;
            cl_uint numPlatforms = 0;

            if( errorCode == CL_SUCCESS )
            {
                errorCode = dispatch().clGetPlatformIDs(
                    0,
                    NULL,
                    &numPlatforms );
            }

            if( errorCode == CL_SUCCESS && numPlatforms != 0 )
            {
                logf( "\nEnumerated %u platform%s.\n\n",
                    numPlatforms,
                    numPlatforms > 1 ? "s" : "" );

                cl_platform_id* platforms = new cl_platform_id[numPlatforms];
                if( platforms )
                {
                    errorCode = dispatch().clGetPlatformIDs(
                        numPlatforms,
                        platforms,
                        NULL );
                }
                else
                {
                    errorCode = CL_OUT_OF_HOST_MEMORY;
                }

                for( cl_uint p = 0; p < numPlatforms; p++ )
                {
                    if( errorCode == CL_SUCCESS )
                    {
                        logf( "Platform %u:\n", p );
                        logPlatformInfo( platforms[p] );
                    }

                    cl_uint numDevices = 0;

                    if( errorCode == CL_SUCCESS )
                    {
                        errorCode = dispatch().clGetDeviceIDs(
                            platforms[p],
                            CL_DEVICE_TYPE_ALL,
                            0,
                            NULL,
                            &numDevices );
                    }
                    if( errorCode == CL_SUCCESS && numDevices != 0 )
                    {
                        logf( "\tPlatform has %u device%s.\n\n",
                            numDevices,
                            numDevices > 1 ? "s" : "" );

                        cl_device_id*   devices = new cl_device_id[numDevices];
                        if( devices )
                        {
                            errorCode = dispatch().clGetDeviceIDs(
                                platforms[p],
                                CL_DEVICE_TYPE_ALL,
                                numDevices,
                                devices,
                                NULL );
                        }
                        else
                        {
                            errorCode = CL_OUT_OF_HOST_MEMORY;
                        }

                        for( cl_uint d = 0; d < numDevices; d++ )
                        {
                            if( errorCode == CL_SUCCESS )
                            {
                                logf( "Device %u:\n", d );
                                logDeviceInfo( devices[d] );
                                log( "\n" );
                            }
                        }

                        delete [] devices;
                    }
                }

                delete [] platforms;
            }
        }
    }
}